

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateGyro.cpp
# Opt level: O2

void __thiscall
CalibrateGyro::CalibrateGyro
          (CalibrateGyro *this,string *OutputFile_Kinematic,string *OutputFile_Static)

{
  pointer __ptr;
  long lVar1;
  VecVector3d local_98;
  CalibrateGyro *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  local_78 = OutputFile_Static;
  memset(this,0,0x120);
  local_98.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = this;
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x20) {
    std::__cxx11::string::string
              ((string *)&local_50,
               (string *)((long)&(OutputFile_Kinematic->_M_dataplus)._M_p + lVar1));
    ReadASC(&local_50,&local_98,this->Gyro_Kinematic);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string
              ((string *)&local_70,(string *)((long)&(local_78->_M_dataplus)._M_p + lVar1));
    ReadASC(&local_70,&local_98,this->Gyro_Static);
    std::__cxx11::string::~string((string *)&local_70);
    __ptr = local_98.
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    local_98.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    free(__ptr);
    this = (CalibrateGyro *)
           (&this->Gyro_Kinematic[0].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           + 1);
  }
  free(local_98.
       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

CalibrateGyro::CalibrateGyro(string* OutputFile_Kinematic, string* OutputFile_Static)
{
    VecVector3d accel_temp;
    for(int i = 0; i < 6; ++i)
    {
        try
        {
            ReadASC(OutputFile_Kinematic[i], accel_temp, this->Gyro_Kinematic[i]);
            ReadASC(OutputFile_Static[i], accel_temp, this->Gyro_Static[i]);
        }
        catch(...)
        {
            cout << "数组越界，请检查！" << endl;
        }
        vector<Vector3d, Eigen::aligned_allocator<Vector3d>>().swap(accel_temp);
    }
}